

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpMessages.cpp
# Opt level: O1

string * ApprovalTests::HelpMessages::envVarErrorMessage
                   (string *__return_storage_ptr__,string *envVarName,string *selected,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *knowns,string *helpMessage)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  pointer pcVar4;
  string *__return_storage_ptr___00;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *known;
  pointer pbVar6;
  stringstream ss;
  string local_290;
  string local_270;
  string *local_250;
  string *local_248;
  string *local_240;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_250 = __return_storage_ptr__;
  local_248 = envVarName;
  local_240 = selected;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pbVar6 = (knowns->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (knowns->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar6 != pbVar3) {
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"* ",2);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
      local_270._M_dataplus._M_p._0_1_ = 10;
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_270,1);
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar3);
  }
  pcVar4 = (helpMessage->_M_dataplus)._M_p;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar4,pcVar4 + helpMessage->_M_string_length);
  paVar1 = &local_290.field_2;
  local_290._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"[selected]","");
  StringUtils::replaceAll(&local_270,&local_1f8,&local_290,(string *)local_240);
  ::std::__cxx11::string::operator=((string *)helpMessage,(string *)&local_270);
  paVar2 = &local_270.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_270._M_dataplus._M_p._1_7_,local_270._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_270._M_dataplus._M_p._1_7_,local_270._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  pcVar4 = (helpMessage->_M_dataplus)._M_p;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_218,pcVar4,pcVar4 + helpMessage->_M_string_length);
  local_290._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"[envVarName]","");
  StringUtils::replaceAll(&local_270,&local_218,&local_290,(string *)local_248);
  ::std::__cxx11::string::operator=((string *)helpMessage,(string *)&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_270._M_dataplus._M_p._1_7_,local_270._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_270._M_dataplus._M_p._1_7_,local_270._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  pcVar4 = (helpMessage->_M_dataplus)._M_p;
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_238,pcVar4,pcVar4 + helpMessage->_M_string_length);
  local_290._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"[known]","");
  __return_storage_ptr___00 = local_250;
  ::std::__cxx11::stringbuf::str();
  StringUtils::replaceAll(&local_270,&local_238,&local_290,&local_1d8);
  topAndTailHelpMessage(__return_storage_ptr___00,(string *)&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_270._M_dataplus._M_p._1_7_,local_270._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_270._M_dataplus._M_p._1_7_,local_270._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr___00;
}

Assistant:

std::string HelpMessages::envVarErrorMessage(const std::string& envVarName,
                                                 const std::string& selected,
                                                 const std::vector<std::string>& knowns,
                                                 std::string& helpMessage)
    {
        std::stringstream ss;
        for (auto& known : knowns)
        {
            ss << "* " << known << '\n';
        }
        helpMessage = StringUtils::replaceAll(helpMessage, "[selected]", selected);
        helpMessage = StringUtils::replaceAll(helpMessage, "[envVarName]", envVarName);
        return topAndTailHelpMessage(
            StringUtils::replaceAll(helpMessage, "[known]", ss.str()));
    }